

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

int getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
              (deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *t,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                  *u)

{
  _Elt_pointer ppVar1;
  bool bVar2;
  _Elt_pointer ppVar3;
  int iVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *uu;
  _Elt_pointer __x;
  _Map_pointer pppVar5;
  
  __x = (t->
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        )._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar3 = (t->
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar5 = (t->
            super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar1 = (t->
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  iVar4 = 0;
  while( true ) {
    if (__x == ppVar1) {
      return -1;
    }
    bVar2 = std::operator==(__x,u);
    if (bVar2) break;
    iVar4 = iVar4 + 1;
    __x = __x + 1;
    if (__x == ppVar3) {
      __x = pppVar5[1];
      pppVar5 = pppVar5 + 1;
      ppVar3 = __x + 0xc;
    }
  }
  return iVar4;
}

Assistant:

int getInd(const T&t,const U&u){
    int i=0;
    for(const U&uu:t) {
        if(uu==u)
            return i;
        else
            i++;
    }
    return -1;
}